

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

size_t __thiscall CLI::App::count_all(App *this)

{
  Option *pOVar1;
  pointer psVar2;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *opt;
  pointer puVar3;
  size_t sVar4;
  size_type sVar5;
  long lVar6;
  shared_ptr<CLI::App> *sub;
  pointer psVar7;
  
  lVar6 = 0;
  for (puVar3 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 != (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    pOVar1 = (puVar3->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    lVar6 = lVar6 + ((long)*(pointer *)
                            ((long)&(pOVar1->results_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&(pOVar1->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl >> 5);
  }
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2; psVar7 = psVar7 + 1) {
    sVar4 = count_all((psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    lVar6 = lVar6 + sVar4;
  }
  sVar5 = (this->name_)._M_string_length;
  if (sVar5 != 0) {
    sVar5 = this->parsed_;
  }
  return sVar5 + lVar6;
}

Assistant:

std::size_t count_all() const {
        std::size_t cnt{0};
        for(auto &opt : options_) {
            cnt += opt->count();
        }
        for(auto &sub : subcommands_) {
            cnt += sub->count_all();
        }
        if(!get_name().empty()) {  // for named subcommands add the number of times the subcommand was called
            cnt += parsed_;
        }
        return cnt;
    }